

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O1

void __thiscall FIX::HttpServer::onConfigure(HttpServer *this,SessionSettings *s)

{
  int iVar1;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"HttpAcceptPort","");
  iVar1 = Dictionary::getInt(&s->m_defaults,&local_40);
  this->m_port = iVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void HttpServer::onConfigure( const SessionSettings& s )
EXCEPT ( ConfigError )
{
  m_port = s.get().getInt( HTTP_ACCEPT_PORT );
}